

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O3

uint32_t __thiscall ExportEntryWrapper::getFuncNameId(ExportEntryWrapper *this)

{
  undefined2 uVar1;
  ExportDirWrapper *pEVar2;
  uint32_t uVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  
  pEVar2 = this->parentDir;
  uVar3 = 0xffffffff;
  if ((pEVar2 != (ExportDirWrapper *)0x0) &&
     (p_Var6 = (pEVar2->ordToNameId)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var6 != (_Base_ptr)0x0)) {
    uVar1 = (undefined2)(this->super_ExeNodeWrapper).entryNum;
    p_Var4 = &(pEVar2->ordToNameId)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var4->_M_header;
    do {
      bVar7 = (ushort)(short)p_Var6[1]._M_color < (ushort)uVar1;
      if (!bVar7) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar7];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var4) &&
       ((ushort)(short)p_Var5[1]._M_color <= (ushort)uVar1)) {
      uVar3 = *(uint32_t *)&p_Var5[1].field_0x4;
    }
  }
  return uVar3;
}

Assistant:

uint32_t ExportEntryWrapper::getFuncNameId()
{
    if (this->parentDir == NULL) return INVALID_ID;

    WORD ord = static_cast<WORD>(this->entryNum);
    std::map<WORD, DWORD>::iterator found = parentDir->ordToNameId.find(ord);
    if (found == parentDir->ordToNameId.end()) {
        return INVALID_ID;
    }
    return found->second;
}